

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void examine_app14(j_decompress_ptr cinfo,JOCTET *data,uint datalen,INT32 remaining)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  jpeg_error_mgr *pjVar6;
  int *_mp;
  uint transform;
  uint flags1;
  uint flags0;
  uint version;
  INT32 remaining_local;
  uint datalen_local;
  JOCTET *data_local;
  j_decompress_ptr cinfo_local;
  
  if ((((datalen < 0xc) || (*data != 'A')) || (data[1] != 'd')) ||
     (((data[2] != 'o' || (data[3] != 'b')) || (data[4] != 'e')))) {
    cinfo->err->msg_code = 0x50;
    (cinfo->err->msg_parm).i[0] = datalen + (int)remaining;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  }
  else {
    bVar1 = data[7];
    bVar2 = data[8];
    bVar3 = data[9];
    bVar4 = data[10];
    bVar5 = data[0xb];
    pjVar6 = cinfo->err;
    (pjVar6->msg_parm).i[0] = (uint)data[5] * 0x100 + (uint)data[6];
    (pjVar6->msg_parm).i[1] = (uint)bVar1 * 0x100 + (uint)bVar2;
    (pjVar6->msg_parm).i[2] = (uint)bVar3 * 0x100 + (uint)bVar4;
    *(uint *)((long)&pjVar6->msg_parm + 0xc) = (uint)bVar5;
    cinfo->err->msg_code = 0x4e;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    cinfo->saw_Adobe_marker = 1;
    cinfo->Adobe_transform = bVar5;
  }
  return;
}

Assistant:

LOCAL(void)
examine_app14 (j_decompress_ptr cinfo, JOCTET FAR * data,
	       unsigned int datalen, INT32 remaining)
/* Examine first few bytes from an APP14.
 * Take appropriate action if it is an Adobe marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  unsigned int version, flags0, flags1, transform;

  if (datalen >= APP14_DATA_LEN &&
      GETJOCTET(data[0]) == 0x41 &&
      GETJOCTET(data[1]) == 0x64 &&
      GETJOCTET(data[2]) == 0x6F &&
      GETJOCTET(data[3]) == 0x62 &&
      GETJOCTET(data[4]) == 0x65) {
    /* Found Adobe APP14 marker */
    version = (GETJOCTET(data[5]) << 8) + GETJOCTET(data[6]);
    flags0 = (GETJOCTET(data[7]) << 8) + GETJOCTET(data[8]);
    flags1 = (GETJOCTET(data[9]) << 8) + GETJOCTET(data[10]);
    transform = GETJOCTET(data[11]);
    TRACEMS4(cinfo, 1, JTRC_ADOBE, version, flags0, flags1, transform);
    cinfo->saw_Adobe_marker = TRUE;
    cinfo->Adobe_transform = (UINT8) transform;
  } else {
    /* Start of APP14 does not match "Adobe", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP14, (int) (datalen + remaining));
  }
}